

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

void Extra_PrintHexReverse(FILE *pFile,uint *pTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  int local_2c;
  int k;
  int Digit;
  int nDigits;
  int nMints;
  int nVars_local;
  uint *pTruth_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"0x");
  iVar1 = 1 << ((byte)nVars & 0x1f);
  for (local_2c = 0; local_2c < (int)(iVar1 / 4 + (uint)(0 < iVar1 % 4)); local_2c = local_2c + 1) {
    uVar2 = pTruth[local_2c / 8] >> ((byte)(local_2c << 2) & 0x1f) & 0xf;
    if (uVar2 < 10) {
      fprintf((FILE *)pFile,"%d",(ulong)uVar2);
    }
    else {
      fprintf((FILE *)pFile,"%c",(ulong)(uVar2 + 0x37));
    }
  }
  return;
}

Assistant:

void Extra_PrintHexReverse( FILE * pFile, unsigned * pTruth, int nVars )
{
    int nMints, nDigits, Digit, k;

    // write the number into the file
    fprintf( pFile, "0x" );
    nMints  = (1 << nVars);
    nDigits = nMints / 4 + ((nMints % 4) > 0);
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = ((pTruth[k/8] >> (k * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}